

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O2

int highest_bit_set(lword x)

{
  int h;
  int iVar1;
  int i;
  int iVar2;
  
  iVar1 = -1;
  for (iVar2 = 0; iVar2 != 0x40; iVar2 = iVar2 + 1) {
    if ((x & 1U) != 0) {
      iVar1 = iVar2;
    }
    x = x >> 1;
  }
  return iVar1;
}

Assistant:

int highest_bit_set(lword x)
/* return number of highest bit set */
{
  int i,h=-1,n=sizeof(lword)<<3;

  for (i=0; i<n; i++) {
    if (x & 1)
      h = i;
    x >>= 1;
  }
  return h;
}